

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fm_score.cc
# Opt level: O2

void __thiscall
xLearn::FMScore::CalcGrad(FMScore *this,SparseRow *row,Model *model,real_t pg,real_t norm)

{
  string *psVar1;
  int iVar2;
  ostream *poVar3;
  allocator local_66;
  allocator local_65;
  Logger local_64;
  string local_60;
  string local_40;
  
  psVar1 = &(this->super_Score).opt_type_;
  iVar2 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar2 == 0) {
    calc_grad_sgd(this,row,model,pg,norm);
    return;
  }
  iVar2 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar2 != 0) {
    iVar2 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar2 != 0) {
      local_64.severity_ = FATAL;
      std::__cxx11::string::string
                ((string *)&local_40,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/score/fm_score.cc"
                 ,&local_65);
      std::__cxx11::string::string((string *)&local_60,"CalcGrad",&local_66);
      poVar3 = Logger::Start(FATAL,&local_40,0x76,&local_60);
      poVar3 = std::operator<<(poVar3,"Unknow optimization method: ");
      std::operator<<(poVar3,(string *)psVar1);
      std::__cxx11::string::~string((string *)&local_60);
      std::__cxx11::string::~string((string *)&local_40);
      Logger::~Logger(&local_64);
      return;
    }
    calc_grad_ftrl(this,row,model,pg,norm);
    return;
  }
  calc_grad_adagrad(this,row,model,pg,norm);
  return;
}

Assistant:

void FMScore::CalcGrad(const SparseRow* row,
                       Model& model,
                       real_t pg,
                       real_t norm) {
  // Using sgd
  if (opt_type_.compare("sgd") == 0) {
    this->calc_grad_sgd(row, model, pg, norm);
  }
  // Using adagrad
  else if (opt_type_.compare("adagrad") == 0) {
    this->calc_grad_adagrad(row, model, pg, norm);
  }
  // Using ftrl 
  else if (opt_type_.compare("ftrl") == 0) {
    this->calc_grad_ftrl(row, model, pg, norm);
  }
  else {
    LOG(FATAL) << "Unknow optimization method: " << opt_type_;
  }
}